

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sens.c
# Opt level: O3

void sensmassage(int type,Item *qfun,int fn)

{
  uint uVar1;
  int iVar2;
  Symbol *pSVar3;
  Item *pIVar4;
  List *list;
  Symbol *pSVar5;
  int index;
  int iVar6;
  undefined4 in_register_00000014;
  undefined8 uVar7;
  List *pLVar8;
  int iVar9;
  char *__format;
  char *pcVar10;
  char *pcVar11;
  undefined8 uVar12;
  List *pLVar13;
  ulong uVar14;
  List *local_138;
  char dname [100];
  char sname [100];
  
  uVar7 = CONCAT44(in_register_00000014,fn);
  pSVar5 = (qfun->element).sym;
  sprintf(buf,"S_%s",pSVar5->name);
  pSVar3 = lookup(buf);
  if (pSVar3 != (Symbol *)0x0) {
    diag(buf," is user defined and cant be used for SENS");
  }
  pSVar3 = install(buf,(int)pSVar5->type);
  pSVar3->subtype = pSVar5->subtype;
  (pSVar3->u).i = (pSVar5->u).i;
  uVar1 = pSVar5->used;
  pSVar3->used = uVar1;
  if (type == 0x10a) {
    pSVar5->used = (sens_parm + 1) * uVar1;
  }
  if (sensinfo == (List *)0x0) {
    sensinfo = newlist();
  }
  lappendsym(sensinfo,pSVar5);
  pIVar4 = lappendsym(sensinfo,(Symbol *)0x0);
  list = newlist();
  (pIVar4->element).lst = list;
  (qfun->element).sym = pSVar3;
  sprintf(buf,"\nstatic int %s() {\n",pSVar5->name);
  lappendstr(procfunc,buf);
  sprintf(buf,"\nstatic int %s();\n",pSVar3->name);
  linsertstr(procfunc,buf);
  local_138 = parmlist->next;
  if (local_138 != parmlist) {
    iVar9 = 1;
    uVar12 = 1;
    do {
      if (type == 0x10a) {
        sprintf(buf,
                "error=trajecsens(%d, _slist%d, _dlist%d,_p, &%s, %s, %s, %d, _slist%d+%d, _dlist%d+%d);\n if(error){abort_run(error);}\n"
                ,(ulong)uVar1,uVar7,fn,((local_138->element).sym)->name,pSVar3->name,indepsym->name,
                uVar12,uVar7,(ulong)(iVar9 * uVar1),uVar7,(ulong)(iVar9 * uVar1));
        pLVar8 = procfunc;
LAB_001130b4:
        lappendstr(pLVar8,buf);
      }
      else {
        if (type == 0x125) {
          pcVar10 = ((local_138->element).sym)->name;
          pcVar11 = pSVar3->name;
          __format = 
          "error=linearsens(%d, _slist%d, _p, &%s, %s, _coef%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n"
          ;
LAB_00113099:
          sprintf(buf,__format,(ulong)uVar1,uVar7,pcVar10,pcVar11,uVar7,uVar12,uVar7,
                  (ulong)(iVar9 * uVar1));
          pLVar8 = list;
          goto LAB_001130b4;
        }
        if (type == 0x126) {
          pcVar10 = ((local_138->element).sym)->name;
          pcVar11 = pSVar3->name;
          __format = 
          "error=steadysens(%d, _slist%d, _p, &%s, %s, _dlist%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n"
          ;
          goto LAB_00113099;
        }
      }
      pLVar8 = statelist->next;
      if (pLVar8 != statelist) {
        iVar2 = iVar9 * uVar1;
        do {
          iVar6 = ((pLVar8->element).sym)->varnum;
          sprintf(sname,"S_%s_%s",((pLVar8->element).sym)->name,((local_138->element).sym)->name);
          sprintf(dname,"D%s",sname);
          pSVar5 = lookup(sname);
          if (pSVar5 == (Symbol *)0x0) {
            pSVar5 = install(sname,0x13e);
          }
          index = 0;
          if ((((pLVar8->element).sym)->subtype & 0x20) != 0) {
            index = ((pLVar8->element).sym)->araydim;
          }
          depinstall(1,pSVar5,index,"0","1","",(Item *)0x0,0,"");
          *(byte *)&pSVar5->usage = (byte)pSVar5->usage | 8;
          if (type == 0x10a) {
            pSVar5 = lookup(dname);
            if (pSVar5 == (Symbol *)0x0) {
              __assert_fail("s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/sens.c"
                            ,0x10e,"void sensmassage()");
            }
            *(byte *)&pSVar5->usage = (byte)pSVar5->usage | 8;
            if ((((pLVar8->element).sym)->subtype & 0x20) == 0) {
              sprintf(buf,"_slist%d[%d] = &(%s) - _p; _dlist%d[%d] = &(%s) - _p;\n",uVar7,
                      (ulong)(uint)(iVar6 + iVar2),sname,fn,(ulong)(uint)(iVar6 + iVar2),dname);
            }
            else {
              sprintf(buf,
                      "for (_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p; _dlist%d[%d+_i] = (%s + _i) - _p;}\n"
                      ,(ulong)(uint)((pLVar8->element).sym)->araydim,uVar7,
                      (ulong)(uint)(iVar6 + iVar2),sname,uVar7,(ulong)(uint)(iVar6 + iVar2),dname);
            }
          }
          else if (type - 0x125U < 2) {
            if ((((pLVar8->element).sym)->subtype & 0x20) == 0) {
              sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",uVar7,(ulong)(uint)(iVar6 + iVar2),sname);
            }
            else {
              sprintf(buf,"for (_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",
                      (ulong)(uint)((pLVar8->element).sym)->araydim,uVar7,
                      (ulong)(uint)(iVar6 + iVar2),sname);
            }
          }
          lappendstr(initlist,buf);
          pLVar8 = pLVar8->next;
        } while (pLVar8 != statelist);
      }
      iVar9 = iVar9 + 1;
      local_138 = local_138->next;
      uVar12 = 0;
    } while (local_138 != parmlist);
  }
  sprintf(buf,"static int _eplist%d[%d], _emlist%d[%d];\n",uVar7,(ulong)(sens_parm * uVar1),fn,
          (ulong)(sens_parm * uVar1));
  linsertstr(procfunc,buf);
  pLVar8 = parmlist->next;
  if (pLVar8 != parmlist) {
    iVar9 = 0;
    do {
      sprintf(buf,
              "envelope(_p, _slist%d, %d, %s, U_%s,_slist%d+%d, _eplist%d + %d, _emlist%d + %d);\n")
      ;
      lappendstr(list,buf);
      sprintf(buf,"U_%s",((pLVar8->element).sym)->name);
      ifnew_parminstall(buf,"0.05","","");
      pLVar13 = statelist->next;
      if (pLVar13 != statelist) {
        do {
          iVar2 = ((pLVar13->element).sym)->varnum;
          sprintf(sname,"EP_%s_%s",((pLVar13->element).sym)->name,((pLVar8->element).sym)->name);
          sprintf(dname,"EM_%s_%s",((pLVar13->element).sym)->name,((pLVar8->element).sym)->name);
          pSVar5 = lookup(sname);
          if (pSVar5 == (Symbol *)0x0) {
            pSVar5 = install(sname,0x13e);
          }
          iVar6 = 0;
          if ((((pLVar13->element).sym)->subtype & 0x20) != 0) {
            iVar6 = ((pLVar13->element).sym)->araydim;
          }
          depinstall(0,pSVar5,iVar6,"0","1","",(Item *)0x0,0,"");
          *(byte *)&pSVar5->usage = (byte)pSVar5->usage | 8;
          pSVar5 = lookup(dname);
          if (pSVar5 == (Symbol *)0x0) {
            pSVar5 = install(dname,0x13e);
          }
          iVar6 = 0;
          if ((((pLVar13->element).sym)->subtype & 0x20) != 0) {
            iVar6 = ((pLVar13->element).sym)->araydim;
          }
          depinstall(0,pSVar5,iVar6,"0","1","",(Item *)0x0,0,"");
          *(byte *)&pSVar5->usage = (byte)pSVar5->usage | 8;
          if ((((pLVar13->element).sym)->subtype & 0x20) == 0) {
            uVar14 = (ulong)(iVar2 + iVar9 * uVar1);
            sprintf(buf,"_eplist%d[%d] = &(%s) - _p; _emlist%d[%d] = &(%s) - _p;\n",uVar7,uVar14,
                    sname,fn,uVar14,dname);
          }
          else {
            uVar14 = (ulong)(iVar2 + iVar9 * uVar1);
            sprintf(buf,
                    "for (_i=0;_i<%d;_i++){_eplist%d[%d+_i] = (%s + _i) - _p; _emlist%d[%d+_i] = (%s + _i) - _p;}\n"
                    ,(ulong)(uint)((pLVar13->element).sym)->araydim,uVar7,uVar14,sname,uVar7,uVar14,
                    dname);
          }
          lappendstr(initlist,buf);
          pLVar13 = pLVar13->next;
        } while (pLVar13 != statelist);
      }
      pLVar8 = pLVar8->next;
      iVar9 = iVar9 + 1;
    } while (pLVar8 != parmlist);
  }
  pcVar10 = "%s();\n}\n";
  if (type == 0x10a) {
    pcVar10 = "return %s();\n}\n";
  }
  sprintf(buf,pcVar10,pSVar3->name);
  lappendstr(procfunc,buf);
  freelist(&parmlist);
  freelist(&statelist);
  sens_parm = 0;
  return;
}

Assistant:

void sensmassage(type, qfun, fn)
	int type;
	Item *qfun;
	int fn;
{
/*qfun is the list symbol for the name of the derivative block. It has
a count of the number of state variables used.  A copy of this symbol
is made but with the name S_name and qfun is made to point to the new symbol
The old function name is then the name of a new created function which
contains the calls to trajecsens followed by a call to S_name to compute the
Note that trajecsens itself contains calls to S_name.
qfun->sym->used is then multiplied by the (1 + #sens parms used) so that
the solve code doesn't need to be changed.

The slist needs to be augmented and that is done here also. However
since it is declared in solve.c it is necessary to access the number
of parameters being used.
*/

/* extending to nonlinear blocks. Differences:
Number of states remains the same. Statements built here but saved for output
when SOLVE is translated. No derivative variables constructed.
However, the full dlist is constructed since we need the last part
for use by EM variables
This has gotten much more difficult to understand since the nonlinear method
is merged into the code to take advantage of common code.  It would be
conceptually simpler to merely repeat the whole process in a separate file*/
/* extending to linear blocks. Same as nonlinear except that
there is a linearsens call and we must be sure to keep proper state order */
	int nstate, i, j, newjac;
	char sname[100], dname[100];
	Item *q, *q1;
	List *senstmt;	/* nonlinear sens statements (saved in sensinfo) */
	Symbol *oldfun, *newfun, *s;
	
	oldfun = SYM(qfun);
	Sprintf(buf, "S_%s", oldfun->name);
	if (lookup(buf)) {
		diag(buf, " is user defined and cant be used for SENS");
	}
	/*this is a time bomb*/
	newfun = install(buf, oldfun->type);
	newfun->subtype = oldfun->subtype;
	newfun->u.i = oldfun->u.i; /*the listnum*/
	newfun->used = oldfun->used; /*number of states*/
	nstate = oldfun->used;
	if (type == DERIVATIVE) {
		oldfun->used *= (1 + sens_parm);
	}
/* even derivatives need sensinfo since envelope statements go after the
SOLVE for statement */
	if (!sensinfo) {
		sensinfo = newlist();
	}
	Lappendsym(sensinfo, oldfun); /* newton will call oldfun
		which will merely call newfun */
	q = lappendsym(sensinfo, SYM0); /* the second element is a list
		of statements to be constructed below */
	senstmt = newlist();
	LST(q) = senstmt;

	SYM(qfun) = newfun; /* the derivative equations alone are now
				called newfun->name; oldfun will contain
				the trajecsens calls */

	/* build the oldfun function */
	/* In the nonlinear case all statements except call to newfun get
		sent to senstmt */
	/* in the derivative case envelope statements get sent to senstmt */
	Sprintf(buf, "\nstatic int %s() {\n", oldfun->name);
	Lappendstr(procfunc, buf);
	Sprintf(buf, "\nstatic int %s();\n", newfun->name);
	Linsertstr(procfunc, buf);
	newjac = 1;
	i=1;
	ITERATE(q, parmlist) {

if (type == DERIVATIVE) {
		Sprintf(buf, "error=trajecsens(%d, _slist%d, _dlist%d,\
_p, &%s, %s, %s, %d, _slist%d+%d, _dlist%d+%d);\n if(error){abort_run(error);}\n",
nstate,
fn, fn,
SYM(q)->name, newfun->name, indepsym->name, newjac,
fn, nstate*i,
fn, nstate*i);
		Lappendstr(procfunc, buf);
}else if (type == NONLINEAR) {
		Sprintf(buf, "error=steadysens(%d, _slist%d, _p, &%s, %s,\
 _dlist%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n",
			nstate,
			fn,
			SYM(q)->name, newfun->name, fn, newjac,
			fn, nstate*i);
		Lappendstr(senstmt, buf);
}else if (type == LINEAR) {
		Sprintf(buf, "error=linearsens(%d, _slist%d, _p, &%s, %s,\
 _coef%d, %d, _slist%d+%d);\n if(error){abort_run(error);}\n",
			nstate,
			fn,
			SYM(q)->name, newfun->name, fn, newjac,
			fn, nstate*i);
		Lappendstr(senstmt, buf);
}
		newjac = 0;
		/* define S_state_parm and DS_state_parm */
		ITERATE(q1, statelist) {
			j = SYM(q1)->varnum;
			Sprintf(sname, "S_%s_%s", SYM(q1)->name, SYM(q)->name);
			Sprintf(dname, "D%s", sname);
			if ((s = lookup(sname)) == SYM0) {
				s = install(sname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(1, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(1, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;
if (type == DERIVATIVE) {
			s = lookup(dname);
			assert (s);
			s->usage |= DEP;
			/* initialize augmented _slist and _dlist */
			if (SYM(q1)->subtype & ARRAY) {
Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_slist%d[%d+_i] = (%s + _i) - _p; _dlist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}else{
Sprintf(buf, "_slist%d[%d] = &(%s) - _p; _dlist%d[%d] = &(%s) - _p;\n",
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}
}else if (type == NONLINEAR || type == LINEAR) {
			if (SYM(q1)->subtype & ARRAY) {
				Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_slist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
					fn, j + nstate*i, sname);
			}else{
				Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
					fn, j + nstate*i, sname);
			}
}
			Lappendstr(initlist, buf);
		}
		i++;
	}

/* addition of envelope calls by modifying copy of above code
 create EP_state_parm, EM_state_parm using a new eplist and emlist
 respectively.  Also create U_parm with default value of .05 if it
 doesn't already exist as a constant.
 */
 
Sprintf(buf, "static int _eplist%d[%d], _emlist%d[%d];\n",
   fn, nstate*sens_parm, fn, nstate*sens_parm);
   	Linsertstr(procfunc, buf);
   	i = 0;
	ITERATE(q, parmlist) {

		Sprintf(buf, "envelope(_p, _slist%d, %d, %s, U_%s,\
_slist%d+%d, _eplist%d + %d, _emlist%d + %d);\n",
fn, nstate,
SYM(q)->name, SYM(q)->name,
fn, nstate*(1 + i),
fn, nstate*i,
fn, nstate*i);
		Lappendstr(senstmt, buf);

		/* define the uncertainty variables */
		Sprintf(buf, "U_%s", SYM(q)->name);
		IGNORE(ifnew_parminstall(buf, "0.05", "", ""));
		/* define EP_state_parm and EM_state_parm */
		ITERATE(q1, statelist) {
			j = SYM(q1)->varnum;
			Sprintf(sname, "EP_%s_%s", SYM(q1)->name, SYM(q)->name);
			Sprintf(dname, "EM_%s_%s", SYM(q1)->name, SYM(q)->name);
			if ((s = lookup(sname)) == SYM0) {
				s = install(sname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(0, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(0, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;

			if ((s = lookup(dname)) == SYM0) {
				s = install(dname, NAME);
			}
			if (SYM(q1)->subtype & ARRAY) {
depinstall(0, s, SYM(q1)->araydim, "0", "1", "", ITEM0, 0, "");
			}else{
				depinstall(0, s, 0, "0", "1", "", ITEM0, 0, "");
			}
			s->usage |= DEP;

			/* initialize augmented _slist and _dlist */
			if (SYM(q1)->subtype & ARRAY) {
Sprintf(buf, "for (_i=0;_i<%d;_i++){\
_eplist%d[%d+_i] = (%s + _i) - _p; _emlist%d[%d+_i] = (%s + _i) - _p;}\n", SYM(q1)->araydim,
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}else{
Sprintf(buf, "_eplist%d[%d] = &(%s) - _p; _emlist%d[%d] = &(%s) - _p;\n",
fn, j + nstate*i, sname, fn, j + nstate*i, dname);
			}
			Lappendstr(initlist, buf);
		}
		i++;
	}
	if (type == DERIVATIVE) {
		Sprintf(buf, "return %s();\n}\n", newfun->name);
	}else{
		Sprintf(buf, "%s();\n}\n", newfun->name);
	}
	Lappendstr(procfunc, buf);
	freelist(&parmlist);
	freelist(&statelist);
	sens_parm = 0;
}